

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

int WriteToFile(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  undefined1 uVar5;
  char cVar6;
  ostream *poVar7;
  long *plVar8;
  int prn;
  long lVar9;
  long lVar10;
  int in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  string fix;
  ofstream out;
  double in_stack_00000068;
  double in_stack_00000070;
  ifstream in;
  double in_stack_00000978;
  double in_stack_00000980;
  double in_stack_00000988;
  int in_stack_00000990;
  int in_stack_00000994;
  double in_stack_000012a8;
  double in_stack_000012b0;
  double in_stack_000012b8;
  undefined1 *local_498;
  long local_490;
  double local_488;
  int local_480;
  int local_47c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  undefined8 local_430;
  char local_428 [8];
  uint auStack_420 [2];
  byte abStack_418 [192];
  char acStack_358 [24];
  ios_base local_340 [264];
  long local_238 [4];
  uint auStack_218 [122];
  
  std::ifstream::ifstream(local_238);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"result.txt","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 param_1,&local_458);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)local_438);
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  uVar2 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  std::ifstream::close();
  std::ofstream::ofstream((ofstream *)local_438);
  std::operator+(&local_478,param_1,&local_458);
  std::ofstream::open((string *)local_438,(_Ios_Openmode)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  if ((abStack_418[*(long *)((long)local_438 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error happened when writing file",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    local_438 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = _connect;
    std::filebuf::~filebuf((filebuf *)&local_430);
    std::ios_base::~ios_base(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    return 1;
  }
  if ((uVar2 & 7) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,
               "Week      SOW         ECEF/X-m      ECEF/Y-m      ECEF/Z-m     ",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,"REF-ECEF/X-m  REF-ECEF/Y-m    ECEF/Z-m      ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_438,
               "EAST/m  NORTH/m  UP/m    B/deg     L/deg     H/m      VX-m/s  VY-m/s  VZ-m/s     PDOP  Sigma-m  Sigma-m/s    BDSObsNum     GPSObsNum"
               ,0x84);
    std::ios::widen((char)(ostream *)local_438 + (char)*(undefined8 *)((long)local_438 + -0x18));
    std::ostream::put((char)local_438);
    std::ostream::flush();
  }
  iVar4 = in_stack_00000008;
  *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) =
       *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)&local_430 + *(long *)((long)local_438 + -0x18)) = 4;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_438,in_stack_00000008);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  local_488 = in_stack_00000010;
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000010);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000018);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000020);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000028);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  if (((double)fix._M_string_length != -1.0) || (NAN((double)fix._M_string_length))) {
    poVar7 = std::ostream::_M_insert<double>((double)fix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
    poVar7 = std::ostream::_M_insert<double>((double)fix.field_2._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
    poVar7 = std::ostream::_M_insert<double>((double)fix.field_2._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  }
  pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
  pcVar1[0] = '\b';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000978);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000980);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000988);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000030);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000038);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>((double)fix._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
  pcVar1[0] = '\b';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  poVar7 = std::ostream::_M_insert<double>(_out);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000068);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
  poVar7 = std::ostream::_M_insert<double>(in_stack_00000070);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
  pcVar1[0] = '\b';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  poVar7 = std::ostream::_M_insert<double>(in_stack_000012b8);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
  poVar7 = std::ostream::_M_insert<double>(in_stack_000012a8);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 8;
  poVar7 = std::ostream::_M_insert<double>(in_stack_000012b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
  pcVar1[0] = '\n';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  local_47c = in_stack_00000994;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_438,in_stack_00000994);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 10;
  local_480 = in_stack_00000990;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,in_stack_00000990);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"       ",7);
  local_490 = 0x154;
  lVar9 = 0x10;
  do {
    if (((*(double *)(&stack0x00000008 + local_490 * 2) != 0.0) ||
        (NAN(*(double *)(&stack0x00000008 + local_490 * 2)))) &&
       ((*(double *)(&stack0x00000008 + lVar9 * 2) != -1.0 ||
        (NAN(*(double *)(&stack0x00000008 + lVar9 * 2)))))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"C",1);
      pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      local_498 = local_438 + *(long *)((long)local_438 + -0x18);
      if (acStack_358[*(long *)((long)local_438 + -0x18) + 1] == '\0') {
        uVar5 = std::ios::widen((char)local_498);
        local_498[0xe0] = uVar5;
        local_498[0xe1] = 1;
      }
      local_498[0xe0] = 0x30;
      std::ostream::operator<<((ostream *)local_438,(int)local_490 + -0x153);
    }
    local_490 = local_490 + 1;
    lVar9 = lVar9 + 3;
  } while (lVar9 != 0xd0);
  local_490 = -0x60;
  lVar9 = 0;
  do {
    if (((*(double *)(&stack0x000009a8 + lVar9 * 8) != 0.0) ||
        (NAN(*(double *)(&stack0x000009a8 + lVar9 * 8)))) &&
       ((*(double *)(&stack0x00000988 + local_490 * 8) != -1.0 ||
        (NAN(*(double *)(&stack0x00000988 + local_490 * 8)))))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"G",1);
      pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
      pcVar1[0] = '\x02';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      local_498 = local_438 + *(long *)((long)local_438 + -0x18);
      if (acStack_358[*(long *)((long)local_438 + -0x18) + 1] == '\0') {
        uVar5 = std::ios::widen((char)local_498);
        local_498[0xe0] = uVar5;
        local_498[0xe1] = 1;
      }
      local_498[0xe0] = 0x30;
      std::ostream::operator<<((ostream *)local_438,(int)lVar9 + 1);
    }
    lVar9 = lVar9 + 1;
    local_490 = local_490 + 3;
  } while (local_490 != 0);
  std::ios::widen((char)local_438 + (char)*(undefined8 *)((long)local_438 + -0x18));
  std::ostream::put((char)local_438);
  std::ostream::flush();
  std::ofstream::close();
  std::__cxx11::string::_M_replace((ulong)&local_458,0,(char *)local_458._M_string_length,0x11115a);
  std::operator+(&local_478,param_1,&local_458);
  std::ofstream::open((string *)local_438,(_Ios_Openmode)&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) =
       *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)&local_430 + *(long *)((long)local_438 + -0x18)) = 4;
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_438,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  poVar7 = std::ostream::_M_insert<double>(local_488);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
  pcVar1[0] = '\x03';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_438,local_47c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 3;
  plVar8 = (long *)std::ostream::operator<<((ostream *)poVar7,local_480);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  lVar9 = 0x154;
  lVar10 = 0x10;
  do {
    if ((*(double *)(&stack0x00000008 + lVar9 * 2) != 0.0) ||
       (NAN(*(double *)(&stack0x00000008 + lVar9 * 2)))) {
      local_488 = *(double *)(&stack0x00000008 + lVar10 * 2);
      if ((local_488 != -1.0) || (NAN(local_488))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"C",1);
        pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
        pcVar1[0] = '\x02';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        lVar3 = *(long *)((long)local_438 + -0x18);
        if (acStack_358[lVar3 + 1] == '\0') {
          cVar6 = std::ios::widen((char)&local_498 + (char)lVar3 + '`');
          acStack_358[lVar3] = cVar6;
          acStack_358[lVar3 + 1] = '\x01';
        }
        acStack_358[lVar3] = '0';
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_438,(int)lVar9 + -0x153);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        lVar3 = *(long *)((long)local_438 + -0x18);
        if (acStack_358[lVar3 + 1] == '\0') {
          cVar6 = std::ios::widen((char)&local_498 + (char)lVar3 + '`');
          acStack_358[lVar3] = cVar6;
          acStack_358[lVar3 + 1] = '\x01';
        }
        acStack_358[lVar3] = ' ';
        *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)&local_430 + *(long *)((long)local_438 + -0x18)) = 4;
        pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
        pcVar1[0] = '\x0f';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0xfffffffffffffff8 + lVar10 * 8))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000000 + lVar10 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
        poVar7 = std::ostream::_M_insert<double>(local_488);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)&local_430 + *(long *)((long)local_438 + -0x18)) = 10;
        pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
        pcVar1[0] = '\x0f';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000608 + lVar9 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000308 + lVar9 * 8));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
    }
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 3;
  } while (lVar10 != 0xd0);
  lVar9 = 0xd0;
  lVar10 = 0;
  do {
    if ((*(double *)(&stack0x000009a8 + lVar10 * 8) != 0.0) ||
       (NAN(*(double *)(&stack0x000009a8 + lVar10 * 8)))) {
      local_488 = *(double *)(&stack0x00000008 + lVar9 * 2);
      if ((local_488 != -1.0) || (NAN(local_488))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"G",1);
        pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
        pcVar1[0] = '\x02';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        lVar3 = *(long *)((long)local_438 + -0x18);
        if (acStack_358[lVar3 + 1] == '\0') {
          cVar6 = std::ios::widen((char)&local_498 + (char)lVar3 + '`');
          acStack_358[lVar3] = cVar6;
          acStack_358[lVar3 + 1] = '\x01';
        }
        acStack_358[lVar3] = '0';
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_438,(int)lVar10 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        lVar3 = *(long *)((long)local_438 + -0x18);
        if (acStack_358[lVar3 + 1] == '\0') {
          cVar6 = std::ios::widen((char)&local_498 + (char)lVar3 + '`');
          acStack_358[lVar3] = cVar6;
          acStack_358[lVar3 + 1] = '\x01';
        }
        acStack_358[lVar3] = ' ';
        *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)&local_430 + *(long *)((long)local_438 + -0x18)) = 4;
        pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
        pcVar1[0] = '\x0f';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0xfffffffffffffff8 + lVar9 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000000 + lVar9 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
        poVar7 = std::ostream::_M_insert<double>(local_488);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) =
             *(uint *)((long)auStack_420 + *(long *)((long)local_438 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)((long)&local_430 + *(long *)((long)local_438 + -0x18)) = 10;
        pcVar1 = local_428 + *(long *)((long)local_438 + -0x18);
        pcVar1[0] = '\x0f';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000fa8 + lVar10 * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
        *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
        poVar7 = std::ostream::_M_insert<double>(*(double *)(&stack0x00000ca8 + lVar10 * 8));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
    }
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 3;
  } while( true );
}

Assistant:

int WriteToFile(SPPResult result, string path){
    ifstream in;
    string fix = "result.txt";
    in.open(path + fix);
    bool isdata = false;
    if(in.eof() || !in)
        isdata = true;
    in.close();

    ofstream out;
    out.open(path + fix, ios::app);
    if(!out){
        cout << "error happened when writing file" << endl;
        return 1;
    }
    out.right;
    if(isdata) {
        out << "Week      SOW         ECEF/X-m      ECEF/Y-m      ECEF/Z-m     ";
        out << "REF-ECEF/X-m  REF-ECEF/Y-m    ECEF/Z-m      ";
        out << "EAST/m  NORTH/m  UP/m    B/deg     L/deg     H/m      VX-m/s  VY-m/s  VZ-m/s     PDOP  Sigma-m  Sigma-m/s    BDSObsNum     GPSObsNum" << endl;
    }

    out << fixed << setprecision(4);
    out << result.ObsTime.Week << "  " << result.ObsTime.SOW << "  ";
    out << result.UserPositionXYZ.X << "  " << result.UserPositionXYZ.Y << "  " << result.UserPositionXYZ.Z << "  ";
    if(result.UserRefPositionXYZ.X != -1)
        out << result.UserRefPositionXYZ.X << "  " << result.UserRefPositionXYZ.Y << "  " << result.UserRefPositionXYZ.Z << "  ";
    out << setw(8) << result.diffNeu.X << setw(8) << result.diffNeu.Y << setw(8) << result.diffNeu.Z << "  ";
    out << result.UserPositionBLH.B << "  " << result.UserPositionBLH.L << "  " << result.UserPositionBLH.H << "  ";
    out << setw(8) << result.UserVelocity.X << setw(8) << result.UserVelocity.Y << setw(8) << result.UserVelocity.Z << "  ";
    out << setw(8) << result.PDop << setw(8) << result.UserPositionSigma << setw(8) << result.UserVelocitySigma << "  ";
    out << setw(10) << result.BDSObsNum << "  " << setw(10) << result.GPSObsNum << "       ";
    for(int prn = 0; prn < MAXBDSSRN; ++ prn) {
        if(result.BDSDist[prn] != 0 && result.BDSPosi[prn].Z != -1)
            out << "C" << setw(2) << setfill('0') << prn + 1;
    }
    for(int prn = 0; prn < MAXGPSSRN; ++ prn) {
        if(result.GPSDist[prn] != 0 && result.GPSPosi[prn].Z != -1)
            out << "G" << setw(2) << setfill('0') << prn + 1;
    }
    out << endl;
    out.close();

    fix = "sat.txt";
    out.open(path + fix, ios::app);
    out.right;
    out << fixed << setprecision(4);
    out << result.ObsTime.Week << "  " << result.ObsTime.SOW << "  ";
    out << setw(3) << result.BDSObsNum << "  " << setw(3) << result.GPSObsNum << endl;
    for(int prn = 0; prn < MAXBDSSRN; ++ prn) {
        if(result.BDSDist[prn] != 0 && result.BDSPosi[prn].Z != -1) {
            out << "C" << setw(2) << setfill('0') << prn + 1 << " ";
            out << setfill(' ');
            out << fixed << setprecision(4);
            out << setw(15) << result.BDSPosi[prn].X << "  " << setw(15) << result.BDSPosi[prn].Y << "  " << setw(15) << result.BDSPosi[prn].Z << "  ";
            out << fixed << setprecision(10);
            out << setw(15) << result.BDSAzimuth[prn] << "  " << setw(15) << result.BDSelev[prn] << endl;
        }
    }
    for(int prn = 0; prn < MAXGPSSRN; ++ prn) {
        if(result.GPSDist[prn] != 0 && result.GPSPosi[prn].Z != -1) {
            out << "G" << setw(2) << setfill('0') << prn + 1 << " ";
            out << setfill(' ');
            out << fixed << setprecision(4);
            out << setw(15) << result.GPSPosi[prn].X << "  " << setw(15) << result.GPSPosi[prn].Y << "  " << setw(15) << result.GPSPosi[prn].Z << "  ";
            out << fixed << setprecision(10);
            out << setw(15) << result.GPSAzimuth[prn] << "  " << setw(15) << result.GPSelev[prn] << endl;
        }
    }
}